

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

bool __thiscall TestCase::Start(TestCase *this)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = std::operator==(&this->mTestName,"");
  if (bVar1) {
    pcVar2 = "Bad Test Case, please call SetTestName in TestCase\'s constructor";
  }
  else {
    printf("Running test %s:",(this->mTestName)._M_dataplus._M_p);
    fflush(_stdout);
    JHThread::Thread::Start();
    JHThread::Thread::Join();
    if (this->mTestComplete != false) {
      if (this->mTestPassed == false) {
        printf(" FAILED at %s:%d\n",(this->mFilename)._M_dataplus._M_p,
               (ulong)(uint)this->mLineNumber);
        pcVar2 = (this->mErrorString)._M_dataplus._M_p;
      }
      else {
        pcVar2 = " PASSED";
      }
      puts(pcVar2);
      return this->mTestPassed;
    }
    pcVar2 = " FAILED\nBad Test Case, must call TestPassed or TestFailed before returning";
  }
  puts(pcVar2);
  return false;
}

Assistant:

bool Start() 
	{
		if ( mTestName == "" )
		{
			printf( "Bad Test Case, please call SetTestName in TestCase's constructor\n" );
			return false;
		}

		printf( "Running test %s:", mTestName.c_str() );
		fflush( stdout );
		
		// start thread to run test.
		mThread.Start();
		// wait for test to complete.
		mThread.Join();

		// ensure that it completed.		
		if ( not mTestComplete )
		{
			printf( " FAILED\nBad Test Case, must call TestPassed or TestFailed before returning\n" );
			return false;
		}

		if ( mTestPassed )
			printf( " PASSED\n" );
		else
		{
			printf( " FAILED at %s:%d\n", mFilename.c_str(), mLineNumber );
			printf( "%s\n", mErrorString.c_str() );
		}
		// return test status.
		return mTestPassed;
	}